

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

string * __thiscall
upb::generator::(anonymous_namespace)::MapValueCType_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDefPtr map_field)

{
  _Bool _Var1;
  upb_MessageDef *m;
  upb_FieldDef *this_00;
  undefined1 in_CL;
  
  m = upb_FieldDef_MessageSubDef((upb_FieldDef *)this);
  _Var1 = upb_MessageDef_IsMapEntry(m);
  if (_Var1) {
    this_00 = upb_MessageDef_Field(m,1);
  }
  else {
    this_00 = (upb_FieldDef *)0x0;
  }
  CTypeInternal_abi_cxx11_
            (__return_storage_ptr__,(_anonymous_namespace_ *)this_00,(FieldDefPtr)0x0,(bool)in_CL);
  return __return_storage_ptr__;
}

Assistant:

std::string MapValueCType(upb::FieldDefPtr map_field) {
  return CType(map_field.message_type().map_value());
}